

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O3

chunk * labyrinth_chunk(player *p,wchar_t h,wchar_t w,_Bool lit,_Bool soft)

{
  int iVar1;
  int iVar2;
  loc grid_00;
  loc grid_01;
  loc grid_02;
  loc grid_03;
  loc grid_04;
  _Bool _Var3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  _Bool _Var7;
  int16_t iVar8;
  wchar_t wVar9;
  chunk *pcVar11;
  void *p_00;
  ulong uVar12;
  loc lVar13;
  wchar_t wVar10;
  square *psVar14;
  ulong uVar15;
  loc_conflict lVar16;
  loc_conflict bottom_right;
  int *piVar17;
  undefined7 in_register_00000009;
  size_t len;
  wchar_t *pwVar18;
  loc grid_05;
  undefined7 in_register_00000081;
  wchar_t sb;
  wchar_t sa;
  loc_conflict local_70;
  ulong local_68;
  chunk *local_60;
  wchar_t local_58;
  undefined4 local_54;
  int *local_50;
  ulong local_48;
  loc_conflict grid;
  
  wVar10 = (wchar_t)CONCAT71(in_register_00000081,soft);
  local_54 = (undefined4)CONCAT71(in_register_00000009,lit);
  pcVar11 = (chunk *)cave_new(h + L'\x02',w + L'\x02');
  pcVar11->depth = (int)p->depth;
  len = (long)(w * h) << 2;
  local_58 = w * h;
  p_00 = mem_zalloc(len);
  local_50 = (int *)mem_zalloc(len);
  pwVar18 = &FEAT_PERM;
  local_68 = (ulong)(uint)h;
  draw_rectangle(pcVar11,L'\0',L'\0',h + L'\x01',w + L'\x01',FEAT_PERM,L'\0',true);
  if (wVar10 != L'\0') {
    wVar10 = L'\r';
    pwVar18 = &FEAT_GRANITE;
  }
  fill_rectangle(pcVar11,L'\x01',L'\x01',(wchar_t)local_68,w,*pwVar18,wVar10);
  local_48 = (ulong)(uint)local_58;
  if (L'\0' < local_58) {
    uVar12 = 0;
    do {
      local_50[uVar12] = (int)uVar12;
      *(undefined4 *)((long)p_00 + uVar12 * 4) = 0xffffffff;
      uVar12 = uVar12 + 1;
    } while (local_48 != uVar12);
  }
  local_70.y = L'\0';
  local_60 = pcVar11;
  if (0 < (wchar_t)local_68) {
    do {
      local_70.x = L'\0';
      wVar10 = local_70.y;
      if (L'\0' < w) {
        do {
          wVar10 = local_70.y;
          iVar1 = local_70.x;
          lVar13.y = local_70.y;
          lVar13.x = local_70.x;
          wVar9 = grid_to_i((loc_conflict)lVar13,w);
          lVar13 = next_grid(lVar13,L'\x03');
          pcVar11 = local_60;
          *(wchar_t *)((long)p_00 + (long)wVar9 * 4) = wVar9;
          square_set_feat((chunk_conflict *)local_60,lVar13,FEAT_FLOOR);
          if ((char)local_54 != '\0') {
            psVar14 = square((chunk_conflict *)pcVar11,lVar13);
            flag_on_dbg(psVar14->info,3,2,"square(c, diag)->info","SQUARE_GLOW");
          }
          local_70.x = iVar1 + L'\x02';
        } while (local_70.x < w);
      }
      local_70.y = wVar10 + L'\x02';
    } while (local_70.y < (wchar_t)local_68);
  }
  piVar17 = local_50;
  wVar10 = local_58;
  shuffle(local_50,local_58);
  if (L'\0' < wVar10) {
    local_68 = (ulong)((int)local_68 - 2);
    uVar12 = 0;
    do {
      wVar10 = piVar17[uVar12];
      i_to_grid(wVar10,w,&local_70);
      if (((L'\0' < local_70.x || L'\0' < local_70.y) &&
          (local_70.x <= w + L'\xfffffffe' || local_70.y <= (wchar_t)local_68)) &&
         (local_70.x % 2 != local_70.y % 2)) {
        i_to_grid(wVar10,w,&grid);
        grid_04._1_7_ = grid._1_7_;
        grid_04.x._0_1_ = (byte)grid.x;
        if (((byte)grid.x & 1) == 0) {
          lVar13 = next_grid(grid_04,L'\b');
          wVar10 = grid_to_i((loc_conflict)lVar13,w);
          grid_05._1_7_ = grid._1_7_;
          grid_05.x._0_1_ = (byte)grid.x;
          wVar9 = L'\x02';
        }
        else {
          lVar13 = next_grid(grid_04,L'\x04');
          wVar10 = grid_to_i((loc_conflict)lVar13,w);
          grid_05._1_7_ = grid._1_7_;
          grid_05.x._0_1_ = (byte)grid.x;
          wVar9 = L'\x06';
        }
        lVar13 = next_grid(grid_05,wVar9);
        wVar9 = grid_to_i((loc_conflict)lVar13,w);
        iVar1 = *(int *)((long)p_00 + (long)wVar10 * 4);
        iVar2 = *(int *)((long)p_00 + (long)wVar9 * 4);
        if (iVar1 != iVar2) {
          grid_00.y = local_70.y;
          grid_00.x = local_70.x;
          lVar13 = next_grid(grid_00,L'\x03');
          square_set_feat((chunk_conflict *)local_60,lVar13,FEAT_FLOOR);
          if ((char)local_54 != '\0') {
            grid_01.y = local_70.y;
            grid_01.x = local_70.x;
            lVar13 = next_grid(grid_01,L'\x03');
            psVar14 = square((chunk_conflict *)local_60,lVar13);
            flag_on_dbg(psVar14->info,3,2,"square(c, next_grid(grid, DIR_SE))->info","SQUARE_GLOW");
          }
          uVar15 = 0;
          do {
            if (*(int *)((long)p_00 + uVar15 * 4) == iVar2) {
              *(int *)((long)p_00 + uVar15 * 4) = iVar1;
            }
            uVar15 = uVar15 + 1;
          } while (local_48 != uVar15);
        }
      }
      uVar12 = uVar12 + 1;
      piVar17 = local_50;
    } while (uVar12 != local_48);
  }
  mem_free(p_00);
  mem_free(piVar17);
  lVar16 = loc(1,1);
  pcVar11 = local_60;
  bottom_right = loc(local_60->width + L'\xfffffffe',local_60->height + L'\xfffffffe');
  piVar17 = cave_find_init(lVar16,bottom_right);
  if (L'c' < local_58) {
    uVar12 = local_48 * 0x51eb851f >> 0x25;
    local_50 = piVar17;
    do {
      _Var3 = cave_find_get_grid(&local_70,piVar17);
      if (!_Var3) break;
      grid_02.y = local_70.y;
      grid_02.x = local_70.x;
      _Var3 = square_isempty((chunk_conflict *)pcVar11,grid_02);
      if (_Var3) {
        grid_03.y = local_70.y;
        grid_03.x = local_70.x;
        local_68 = uVar12;
        lVar13 = next_grid(grid_03,L'\x04');
        _Var3 = square_ispassable((chunk_conflict *)pcVar11,lVar13);
        _Var5 = true;
        _Var4 = true;
        if (!_Var3) {
          lVar13 = next_grid(grid_03,L'\x04');
          _Var4 = square_iscloseddoor((chunk_conflict *)pcVar11,lVar13);
        }
        lVar13 = next_grid(grid_03,L'\x06');
        _Var3 = square_ispassable((chunk_conflict *)pcVar11,lVar13);
        if (!_Var3) {
          lVar13 = next_grid(grid_03,L'\x06');
          _Var5 = square_iscloseddoor((chunk_conflict *)pcVar11,lVar13);
        }
        lVar13 = next_grid(grid_03,L'\b');
        _Var3 = square_ispassable((chunk_conflict *)pcVar11,lVar13);
        _Var7 = true;
        _Var6 = true;
        if (!_Var3) {
          lVar13 = next_grid(grid_03,L'\b');
          _Var6 = square_iscloseddoor((chunk_conflict *)pcVar11,lVar13);
        }
        lVar13 = next_grid(grid_03,L'\x02');
        _Var3 = square_ispassable((chunk_conflict *)pcVar11,lVar13);
        if (!_Var3) {
          lVar13 = next_grid(grid_03,L'\x02');
          _Var7 = square_iscloseddoor((chunk_conflict *)local_60,lVar13);
        }
        piVar17 = local_50;
        pcVar11 = local_60;
        uVar12 = local_68;
        if (((_Var6 == _Var7) && (_Var4 == _Var5)) && (_Var6 != _Var4)) {
          lVar16.y = local_70.y;
          lVar16.x = local_70.x;
          place_closed_door((chunk_conflict *)local_60,lVar16);
          uVar12 = (ulong)((int)uVar12 - 1);
        }
      }
    } while (0 < (int)uVar12);
  }
  mem_free(piVar17);
  if ((char)local_54 == '\0') {
    iVar8 = Rand_normal(3,2);
    alloc_objects((chunk_conflict *)pcVar11,L'\x03',L'\x04',(int)iVar8,pcVar11->depth,'\x06');
  }
  if (!soft) {
    iVar8 = Rand_normal(2,1);
    alloc_objects((chunk_conflict *)pcVar11,L'\x03',L'\x05',(int)iVar8,pcVar11->depth,'\x06');
  }
  return pcVar11;
}

Assistant:

static struct chunk *labyrinth_chunk(struct player *p, int h, int w, bool lit,
									 bool soft)
{
	int i, j, k;
	struct loc grid;
	int *find_state;

	/* This is the number of squares in the labyrinth */
	int n = h * w;

	/* NOTE: 'sets' and 'walls' are too large... we only need to use about
	 * 1/4 as much memory. However, in that case, the addressing math
	 * becomes a lot more complicated, so let's just stick with this
	 * because it's easier to read. */

	/* 'sets' tracks connectedness; if sets[i] == sets[j] then cells i and j
	 * are connected to each other in the maze. */
	int *sets;

	/* 'walls' is a list of wall coordinates which we will randomize */
	int *walls;

	/* The labyrinth chunk */
	struct chunk *c = cave_new(h + 2, w + 2);
	c->depth = p->depth;
	/* allocate our arrays */
	sets = mem_zalloc(n * sizeof(int));
	walls = mem_zalloc(n * sizeof(int));

	/* Bound with perma-rock */
	draw_rectangle(c, 0, 0, h + 1, w + 1, FEAT_PERM, SQUARE_NONE, true);

	/* Fill the labyrinth area with rock */
	if (soft)
		fill_rectangle(c, 1, 1, h, w, FEAT_GRANITE, SQUARE_WALL_SOLID);
	else
		fill_rectangle(c, 1, 1, h, w, FEAT_PERM, SQUARE_NONE);

	/* Initialize each wall. */
	for (i = 0; i < n; i++) {
		walls[i] = i;
		sets[i] = -1;
	}

	/* Cut out a grid of 1x1 rooms which we will call "cells" */
	for (grid.y = 0; grid.y < h; grid.y += 2) {
		for (grid.x = 0; grid.x < w; grid.x += 2) {
			int k_local = grid_to_i(grid, w);
			struct loc diag = next_grid(grid, DIR_SE);
			sets[k_local] = k_local;
			square_set_feat(c, diag, FEAT_FLOOR);
			if (lit) sqinfo_on(square(c, diag)->info, SQUARE_GLOW);
		}
	}

	/* Shuffle the walls, using Knuth's shuffle. */
	shuffle(walls, n);

	/* For each adjoining wall, look at the cells it divides. If they aren't
	 * in the same set, remove the wall and join their sets.
	 *
	 * This is a randomized version of Kruskal's algorithm. */
	for (i = 0; i < n; i++) {
		int a, b;

		j = walls[i];

		/* If this cell isn't an adjoining wall, skip it */
		i_to_grid(j, w, &grid);
		if ((grid.x < 1 && grid.y < 1) || (grid.x > w - 2 && grid.y > h - 2))
			continue;
		if (grid.x % 2 == grid.y % 2) continue;

		/* Figure out which cells are separated by this wall */
		lab_get_adjoin(j, w, &a, &b);

		/* If the cells aren't connected, kill the wall and join the sets */
		if (sets[a] != sets[b]) {
			int sa = sets[a];
			int sb = sets[b];
			square_set_feat(c, next_grid(grid, DIR_SE), FEAT_FLOOR);
			if (lit) {
				sqinfo_on(square(c, next_grid(grid, DIR_SE))->info, SQUARE_GLOW);
			}
			for (k = 0; k < n; k++) {
				if (sets[k] == sb) sets[k] = sa;
			}
		}
	}

	/* Deallocate our lists */
	mem_free(sets);
	mem_free(walls);

	/* Generate a door for every 100 squares in the labyrinth */
	find_state = cave_find_init(loc(1, 1),
		loc(c->width - 2, c->height - 2));
	i = n / 100;
	while (i > 0 && cave_find_get_grid(&grid, find_state)) {
		if (square_isempty(c, grid) && lab_is_tunnel(c, grid)) {
			place_closed_door(c, grid);
			--i;
		}
	}
	mem_free(find_state);

	/* Unlit labyrinths will have some good items */
	if (!lit)
		alloc_objects(c, SET_BOTH, TYP_GOOD, Rand_normal(3, 2),
			c->depth, ORIGIN_LABYRINTH);

	/* Hard (non-diggable) labyrinths will have some great items */
	if (!soft)
		alloc_objects(c, SET_BOTH, TYP_GREAT, Rand_normal(2, 1),
			c->depth, ORIGIN_LABYRINTH);

	return c;
}